

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBarrelShape.cpp
# Opt level: O3

void __thiscall
cbtBarrelShape::cbtBarrelShape
          (cbtBarrelShape *this,cbtScalar sY_low,cbtScalar sY_high,cbtScalar sR_vert,
          cbtScalar sR_hor,cbtScalar sR_offset)

{
  cbtConvexInternalShape::cbtConvexInternalShape(&this->super_cbtConvexInternalShape);
  (this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
  _vptr_cbtCollisionShape = (_func_int **)&PTR__cbtConvexShape_00b48fe8;
  *(cbtScalar *)&(this->super_cbtConvexInternalShape).field_0x44 = sY_low;
  this->Y_high = sY_high;
  this->R_vert = sR_vert;
  this->R_hor = sR_hor;
  this->R_offset = sR_offset;
  (this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.m_shapeType =
       0x15;
  return;
}

Assistant:

cbtBarrelShape::cbtBarrelShape(cbtScalar sY_low, cbtScalar sY_high, cbtScalar sR_vert, cbtScalar sR_hor, cbtScalar sR_offset )
{
	Y_low = sY_low;
	Y_high = sY_high; 
	R_vert = sR_vert; 
	R_hor  = sR_hor; 
	R_offset = sR_offset;
	m_shapeType = BARREL_SHAPE_PROXYTYPE;
}